

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O3

void __thiscall
ExampleNLFeeder::
FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SuffixWriterFactory>
          (ExampleNLFeeder *this,SuffixWriterFactory *swf)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  ExampleModel *pEVar4;
  uint uVar5;
  ulong uVar6;
  SuffixIntWriter sw;
  SparseVectorWriter<int,_int> local_28;
  
  pEVar4 = this->mdl_;
  uVar1 = pEVar4->suf[0].kind_;
  if ((uVar1 & 4) == 0) {
    pdVar3 = pEVar4->suf[0].values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = pEVar4->suf[0].values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar6 = 0;
    if (pdVar2 != pdVar3) {
      do {
        uVar5 = (int)uVar6 + (uint)(*pdVar3 != 0.0);
        uVar6 = (ulong)uVar5;
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 != pdVar2);
      if (uVar5 == 0) {
        uVar6 = 0;
      }
      else {
        mp::TextFormatter::apr
                  (&swf->nlw_->super_FormatterType,&swf->nlw_->nm,"S%d %d %s\n",(ulong)uVar1,uVar6,
                   pEVar4->suf[0].name_);
        pEVar4 = this->mdl_;
      }
    }
    local_28.p_nlw_ = swf->nlw_;
    local_28.n_entries_ = uVar6;
    WriteDense2Sparse_Pure<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SparseVectorWriter<int,int>,std::vector<double,std::allocator<double>>>
              (this,&local_28,&pEVar4->suf[0].values_);
  }
  else {
    pdVar3 = pEVar4->suf[0].values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = pEVar4->suf[0].values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar6 = 0;
    if (pdVar2 != pdVar3) {
      do {
        uVar5 = (int)uVar6 + (uint)(*pdVar3 != 0.0);
        uVar6 = (ulong)uVar5;
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 != pdVar2);
      if (uVar5 == 0) {
        uVar6 = 0;
      }
      else {
        mp::TextFormatter::apr
                  (&swf->nlw_->super_FormatterType,&swf->nlw_->nm,"S%d %d %s\n",(ulong)uVar1,uVar6,
                   pEVar4->suf[0].name_);
        pEVar4 = this->mdl_;
      }
    }
    local_28.p_nlw_ = swf->nlw_;
    local_28.n_entries_ = uVar6;
    WriteDense2Sparse_Pure<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SparseVectorWriter<int,double>,std::vector<double,std::allocator<double>>>
              (this,(SparseVectorWriter<int,_double> *)&local_28,&pEVar4->suf[0].values_);
  }
  return;
}

Assistant:

void FeedSuffixes(SuffixWriterFactory& swf) {
    for (int i=0; i<Model().n_suf; ++i) {
      if (Model().suf[i].kind_ & 4) {     // double's
        auto sw = swf.StartDblSuffix(
              Model().suf[i].name_,
              Model().suf[i].kind_,
              CountNNZ(Model().suf[i].values_));
        WriteDense2Sparse_Pure(sw, Model().suf[i].values_);
      } else {                            // int's
        auto sw = swf.StartIntSuffix(
              Model().suf[i].name_,
              Model().suf[i].kind_,
              CountNNZ(Model().suf[i].values_));
        WriteDense2Sparse_Pure(sw, Model().suf[i].values_);
      }
    }
  }